

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieitem.cpp
# Opt level: O0

bool __thiscall
rlottie::internal::renderer::Group::resolveKeyPath
          (Group *this,LOTKeyPath *keyPath,uint32_t depth,LOTVariant *value)

{
  bool bVar1;
  byte bVar2;
  Property prop;
  uint32_t uVar3;
  char *pcVar4;
  string *key;
  __normal_iterator<rlottie::internal::renderer::Object_**,_std::vector<rlottie::internal::renderer::Object_*,_std::allocator<rlottie::internal::renderer::Object_*>_>_>
  *__lhs;
  reference ppOVar5;
  LOTVariant *in_RCX;
  string *in_RSI;
  long in_RDI;
  Object **child;
  iterator __end2;
  iterator __begin2;
  vector<rlottie::internal::renderer::Object_*,_std::allocator<rlottie::internal::renderer::Object_*>_>
  *__range2;
  uint32_t newDepth;
  string *in_stack_fffffffffffffe28;
  Group *in_stack_fffffffffffffe30;
  undefined8 in_stack_fffffffffffffe38;
  string *psVar6;
  undefined4 in_stack_fffffffffffffe40;
  uint32_t in_stack_fffffffffffffe44;
  LOTVariant *in_stack_fffffffffffffe48;
  FilterData *in_stack_fffffffffffffe50;
  bool local_189;
  undefined7 in_stack_fffffffffffffe88;
  __normal_iterator<rlottie::internal::renderer::Object_**,_std::vector<rlottie::internal::renderer::Object_*,_std::allocator<rlottie::internal::renderer::Object_*>_>_>
  local_128;
  long local_120;
  allocator local_111;
  string local_110 [32];
  uint32_t local_f0;
  allocator local_e9;
  string local_e8 [39];
  allocator local_c1;
  string local_c0 [39];
  allocator local_99;
  string local_98 [39];
  allocator local_71;
  string local_70 [39];
  allocator local_49;
  string local_48 [32];
  LOTVariant *local_28;
  string *local_18;
  
  uVar3 = (uint32_t)((ulong)in_stack_fffffffffffffe38 >> 0x20);
  local_28 = in_RCX;
  local_18 = in_RSI;
  pcVar4 = name(in_stack_fffffffffffffe30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,pcVar4,&local_49);
  bVar1 = LOTKeyPath::skip((LOTKeyPath *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    pcVar4 = internal::model::FilterBase<rlottie::internal::model::Group>::name
                       ((FilterBase<rlottie::internal::model::Group> *)0x161d13);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,pcVar4,&local_71);
    bVar1 = LOTKeyPath::matches((LOTKeyPath *)in_stack_fffffffffffffe48,
                                (string *)
                                CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),uVar3)
    ;
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      return false;
    }
    psVar6 = local_18;
    pcVar4 = internal::model::FilterBase<rlottie::internal::model::Group>::name
                       ((FilterBase<rlottie::internal::model::Group> *)0x161dad);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_98,pcVar4,&local_99);
    uVar3 = (uint32_t)((ulong)pcVar4 >> 0x20);
    bVar1 = LOTKeyPath::skip((LOTKeyPath *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    bVar2 = bVar1 ^ 0xff;
    std::__cxx11::string::~string(local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
    if ((bVar2 & 1) != 0) {
      pcVar4 = internal::model::FilterBase<rlottie::internal::model::Group>::name
                         ((FilterBase<rlottie::internal::model::Group> *)0x161e36);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c0,pcVar4,&local_c1);
      bVar1 = LOTKeyPath::fullyResolvesTo
                        ((LOTKeyPath *)CONCAT17(bVar2,in_stack_fffffffffffffe88),psVar6,uVar3);
      local_189 = false;
      if (bVar1) {
        prop = LOTVariant::property(local_28);
        local_189 = transformProp(prop);
      }
      std::__cxx11::string::~string(local_c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_c1);
      if (local_189 != false) {
        internal::model::FilterBase<rlottie::internal::model::Group>::filter
                  ((FilterBase<rlottie::internal::model::Group> *)in_stack_fffffffffffffe30);
        internal::model::FilterData::addValue(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
      }
    }
  }
  psVar6 = local_18;
  key = (string *)name(in_stack_fffffffffffffe30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e8,(char *)key,&local_e9);
  bVar1 = LOTKeyPath::propagate((LOTKeyPath *)psVar6,key,in_stack_fffffffffffffe44);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  if (bVar1) {
    psVar6 = local_18;
    __lhs = (__normal_iterator<rlottie::internal::renderer::Object_**,_std::vector<rlottie::internal::renderer::Object_*,_std::allocator<rlottie::internal::renderer::Object_*>_>_>
             *)name(in_stack_fffffffffffffe30);
    uVar3 = (uint32_t)((ulong)psVar6 >> 0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_110,(char *)__lhs,&local_111);
    uVar3 = LOTKeyPath::nextDepth
                      ((LOTKeyPath *)key,
                       (string *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),uVar3
                      );
    std::__cxx11::string::~string(local_110);
    std::allocator<char>::~allocator((allocator<char> *)&local_111);
    local_120 = in_RDI + 8;
    local_f0 = uVar3;
    local_128._M_current =
         (Object **)
         std::
         vector<rlottie::internal::renderer::Object_*,_std::allocator<rlottie::internal::renderer::Object_*>_>
         ::begin((vector<rlottie::internal::renderer::Object_*,_std::allocator<rlottie::internal::renderer::Object_*>_>
                  *)in_stack_fffffffffffffe28);
    std::
    vector<rlottie::internal::renderer::Object_*,_std::allocator<rlottie::internal::renderer::Object_*>_>
    ::end((vector<rlottie::internal::renderer::Object_*,_std::allocator<rlottie::internal::renderer::Object_*>_>
           *)in_stack_fffffffffffffe28);
    while (bVar1 = __gnu_cxx::operator!=
                             (__lhs,(__normal_iterator<rlottie::internal::renderer::Object_**,_std::vector<rlottie::internal::renderer::Object_*,_std::allocator<rlottie::internal::renderer::Object_*>_>_>
                                     *)in_stack_fffffffffffffe28), bVar1) {
      ppOVar5 = __gnu_cxx::
                __normal_iterator<rlottie::internal::renderer::Object_**,_std::vector<rlottie::internal::renderer::Object_*,_std::allocator<rlottie::internal::renderer::Object_*>_>_>
                ::operator*(&local_128);
      (*(*ppOVar5)->_vptr_Object[4])(*ppOVar5,local_18,(ulong)local_f0,local_28);
      __gnu_cxx::
      __normal_iterator<rlottie::internal::renderer::Object_**,_std::vector<rlottie::internal::renderer::Object_*,_std::allocator<rlottie::internal::renderer::Object_*>_>_>
      ::operator++(&local_128);
    }
  }
  return true;
}

Assistant:

bool renderer::Group::resolveKeyPath(LOTKeyPath &keyPath, uint32_t depth,
                                     LOTVariant &value)
{
    if (!keyPath.skip(name())) {
        if (!keyPath.matches(mModel.name(), depth)) {
            return false;
        }

        if (!keyPath.skip(mModel.name())) {
            if (keyPath.fullyResolvesTo(mModel.name(), depth) &&
                transformProp(value.property())) {
                mModel.filter()->addValue(value);
            }
        }
    }

    if (keyPath.propagate(name(), depth)) {
        uint32_t newDepth = keyPath.nextDepth(name(), depth);
        for (auto &child : mContents) {
            child->resolveKeyPath(keyPath, newDepth, value);
        }
    }
    return true;
}